

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_3::
         GeneratedClassNameImpl<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc)

{
  Descriptor *b;
  AlphaNum *in_R9;
  string_view sVar1;
  AlphaNum local_1f8;
  AlphaNum local_1c8;
  string_view local_198;
  AlphaNum local_188;
  string_view local_158;
  string local_148;
  AlphaNum local_128;
  string local_f8;
  Descriptor *local_d8;
  Descriptor *containing;
  char *local_c8;
  AlphaNum local_c0;
  string_view local_80;
  string local_70;
  AlphaNum local_50;
  undefined1 local_19;
  Descriptor *local_18;
  Descriptor *desc_local;
  string *classname;
  
  local_19 = 0;
  local_18 = desc;
  desc_local = (Descriptor *)__return_storage_ptr__;
  local_80 = Descriptor::name(desc);
  ClassNamePrefixImpl<google::protobuf::Descriptor>(&local_70,local_80,local_18);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
  sVar1 = Descriptor::name(local_18);
  local_c8 = sVar1._M_str;
  b = (Descriptor *)sVar1._M_len;
  containing = b;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,sVar1);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_50,&local_c0,(AlphaNum *)b);
  std::__cxx11::string::~string((string *)&local_70);
  local_d8 = Descriptor::containing_type(local_18);
  while (local_d8 != (Descriptor *)0x0) {
    sVar1 = Descriptor::name(local_d8);
    local_158 = sVar1;
    ClassNamePrefixImpl<google::protobuf::Descriptor>(&local_148,sVar1,local_18);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_128,&local_148);
    sVar1 = Descriptor::name(local_d8);
    local_198 = sVar1;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_188,sVar1);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1c8,"\\");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1f8,__return_storage_ptr__);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_f8,(lts_20250127 *)&local_128,&local_188,&local_1c8,&local_1f8,in_R9);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_148);
    local_d8 = Descriptor::containing_type(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedClassNameImpl(const DescriptorType* desc) {
  std::string classname =
      absl::StrCat(ClassNamePrefixImpl(desc->name(), desc), desc->name());
  const Descriptor* containing = desc->containing_type();
  while (containing != nullptr) {
    classname = absl::StrCat(ClassNamePrefixImpl(containing->name(), desc),
                             containing->name(), "\\", classname);
    containing = containing->containing_type();
  }
  return classname;
}